

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

bool __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseMatch<0ul,kj::StringPtr&>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,char (*params) [7])

{
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> AVar4;
  unsigned_long *pos;
  StringPtr *local_50;
  char (*local_48) [7];
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos741;
  char (*params_local) [7];
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  _pos741.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)params;
  pHVar1 = get<0ul,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>&>
                     ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(this + 0x20));
  AVar4 = Vector<kj::TreeMap<kj::String,_int>::Entry>::asPtr
                    ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
  fwd<kj::StringPtr&>((StringPtr *)_pos741.field_1);
  local_50 = AVar4.ptr;
  local_48 = (char (*) [7])AVar4.size_;
  AVar4.size_ = (size_t)local_50;
  AVar4.ptr = (StringPtr *)pHVar1;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr&>
            ((TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> *)&local_40,AVar4,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 != (unsigned_long *)0x0) {
    puVar3 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
    ::eraseImpl((Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
                 *)this,*puVar3);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return puVar2 != (unsigned_long *)0x0;
}

Assistant:

bool Table<Row, Indexes...>::eraseMatch(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    eraseImpl(pos);
    return true;
  } else {
    return false;
  }
}